

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O1

int s3phseg_read(char *fn,acmod_set_t *acmod_set,s3phseg_t **out_phseg)

{
  s3phseg_s *psVar1;
  acmod_set_t *acmod_set_00;
  int iVar2;
  acmod_id_t id;
  uint32 uVar3;
  acmod_id_t aVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  s3phseg_t *psVar7;
  s3phseg_s *psVar8;
  int iVar9;
  s3phseg_t *ptr;
  uint sf;
  int score;
  uint ef;
  char txt [512];
  uint32 local_254;
  acmod_id_t local_250;
  uint32 local_24c;
  acmod_set_t *local_248;
  undefined8 local_240;
  int local_238;
  short local_234;
  
  local_248 = acmod_set;
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0x40,"Failed to open phseg file %s\n",fn);
  }
  else {
    local_240 = out_phseg;
    do {
      iVar2 = __isoc99_fscanf(__stream,"%511s",&local_238);
      if (iVar2 == 0) break;
      if (iVar2 == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                ,0x46,"Failed to read column headers from phseg file\n");
        goto LAB_0012fdc8;
      }
    } while (local_234 != 0x65 || local_238 != 0x6e6f6850);
    ptr = (s3phseg_t *)0x0;
    do {
      iVar2 = feof(__stream);
      if (iVar2 != 0) goto LAB_0012fd75;
      iVar2 = __isoc99_fscanf(__stream,"%u %u %d",&local_254,&local_24c,&local_250);
      iVar9 = 6;
      if (2 < iVar2) {
        fgets((char *)&local_238,0x200,__stream);
        sVar5 = strlen((char *)&local_238);
        if (*(char *)((long)&local_238 + (sVar5 - 1)) == '\n') {
          *(undefined1 *)((long)&local_240 + sVar5 + 7) = 0;
        }
        sVar5 = strspn((char *)&local_238," \t");
        pcVar6 = strchr((char *)((long)&local_238 + sVar5),0x20);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
        id = acmod_set_name2id(local_248,(char *)&local_238);
        acmod_set_00 = local_248;
        if (id == 0xffffffff) {
          iVar9 = 4;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                  ,0x60,"Unknown CI phone (%s) in phseg file\n",&local_238);
        }
        else {
          if (pcVar6 != (char *)0x0) {
            *pcVar6 = ' ';
          }
          aVar4 = id;
          if (((local_248->n_multi != 0) &&
              (uVar3 = acmod_set_has_attrib(local_248,id,"filler"), uVar3 == 0)) &&
             (aVar4 = acmod_set_name2id(acmod_set_00,(char *)&local_238), aVar4 == 0xffffffff)) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                    ,0x69,"Unknown triphone (%s) in phseg file\n",&local_238);
            aVar4 = id;
          }
          psVar7 = (s3phseg_t *)
                   __ckd_calloc__(1,0x20,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                  ,0x6e);
          psVar7->next = ptr;
          psVar7->phone = aVar4;
          psVar7->sf = local_254;
          psVar7->ef = local_24c;
          psVar7->score = local_250;
          iVar9 = 0;
          ptr = psVar7;
        }
      }
    } while (iVar9 == 0);
    if (iVar9 == 2) goto LAB_0012fdd6;
    if (iVar9 != 4) {
LAB_0012fd75:
      fclose(__stream);
      __stream = (FILE *)0x0;
      if (local_240 == (s3phseg_t **)0x0) {
        local_240 = (s3phseg_t **)0x0;
        while (__stream = (FILE *)0x0, ptr != (s3phseg_t *)0x0) {
          psVar8 = ptr->next;
          ckd_free(ptr);
          ptr = psVar8;
        }
      }
      else if (ptr != (s3phseg_t *)0x0) {
        psVar8 = (s3phseg_s *)0x0;
        do {
          psVar1 = ptr->next;
          *local_240 = ptr;
          ptr->next = psVar8;
          psVar8 = *local_240;
          ptr = psVar1;
        } while (psVar1 != (s3phseg_s *)0x0);
      }
      goto LAB_0012fdd6;
    }
LAB_0012fdc8:
    fclose(__stream);
  }
  __stream = (FILE *)0xffffffff;
LAB_0012fdd6:
  return (int)__stream;
}

Assistant:

int
s3phseg_read(const char *fn,
	     acmod_set_t *acmod_set,
	     s3phseg_t **out_phseg)
{
	FILE *fp;
	char txt[512];
	s3phseg_t *plist = NULL;
	int n;

	if ((fp = fopen(fn, "r")) == NULL) {
		E_ERROR("Failed to open phseg file %s\n", fn);
		return S3_ERROR;
	}
	/* Should be a header of column names */
	while ((n = fscanf(fp, "%511s", txt))) {
		if (n == EOF) {
			E_ERROR("Failed to read column headers from phseg file\n");
			goto error_out;
		}
		if (!strcmp(txt, "Phone"))
			break;
	}
	/* Get each line */
	while (!feof(fp)) {
		unsigned int sf, ef;
		int score;
		acmod_id_t ci, phone;
		s3phseg_t *phseg;
		char *c, *cc;

		n = fscanf(fp, "%u %u %d", &sf, &ef, &score);
		if (n < 3) /* We probably hit EOF or "Total score" */
			break;
		fgets(txt, sizeof(txt), fp);
		/* Remove newline. */
		if (txt[strlen(txt)-1] == '\n')
			txt[strlen(txt)-1] = '\0';
		/* Find the base phone. */
		cc = txt + strspn(txt, " \t");
		if ((c = strchr(cc, ' ')))
			*c = '\0';
		if ((ci = phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
			E_ERROR("Unknown CI phone (%s) in phseg file\n", txt);
			goto error_out;
		}
		/* Restore the space and find the triphone if necessary. */
		if (c) *c = ' ';
		if (acmod_set->n_multi != 0
		    && !acmod_set_has_attrib(acmod_set, phone, "filler")) {
			if ((phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
				/* This might be too verbose. */
				E_WARN("Unknown triphone (%s) in phseg file\n", txt);
				/* Back off to CI phone. */
				phone = ci;
			}
		}
		phseg = ckd_calloc(1, sizeof(*phseg));
		phseg->next = plist;
		phseg->phone = phone;
		phseg->sf = sf;
		phseg->ef = ef;
		phseg->score = score;
		plist = phseg;
	}
	fclose(fp);
	if (out_phseg) {
		s3phseg_t *next, *last = NULL;
		/* Now reverse the list. */
		while (plist) {
			next = plist->next;
			*out_phseg = plist;
			(*out_phseg)->next = last;
			last = *out_phseg;
			plist = next;
		}
	}
	else
		s3phseg_free(plist);
	return S3_SUCCESS;
error_out:
	fclose(fp);
	return S3_ERROR;
}